

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGrow *curr)

{
  pointer pLVar1;
  char *pcVar2;
  Flow *pFVar3;
  Flow *pFVar4;
  Flow *pFVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  Type *pTVar10;
  pointer *ppLVar11;
  ulong x;
  ulong uVar12;
  Name NVar13;
  undefined1 local_198 [8];
  Flow ret;
  undefined1 local_138 [8];
  Flow fail;
  undefined1 local_d8 [8];
  Flow valueFlow;
  Flow deltaFlow;
  TableInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_d8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (valueFlow.breakTo.super_IString.str._M_len != 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_d8;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&valueFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)valueFlow.breakTo.super_IString.str._M_len;
    goto LAB_001be808;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&valueFlow.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
  if (deltaFlow.breakTo.super_IString.str._M_len == 0) {
    getTableInstanceInfo
              ((TableInstanceInfo *)&deltaFlow.breakTo.super_IString.str._M_str,this,
               (Name)*(string_view *)(curr + 0x10));
    uVar7 = (**(code **)(**(long **)(deltaFlow.breakTo.super_IString.str._M_str + 0x200) + 0xd8))
                      (*(long **)(deltaFlow.breakTo.super_IString.str._M_str + 0x200),info.instance,
                       info.name.super_IString.str._M_len);
    NVar13.super_IString.str._M_str = (char *)info.instance;
    NVar13.super_IString.str._M_len = *(size_t *)(deltaFlow.breakTo.super_IString.str._M_str + 0x20)
    ;
    lVar8 = wasm::Module::getTable(NVar13);
    x = (ulong)uVar7;
    Literal::makeFromInt64
              ((Literal *)&ret.breakTo.super_IString.str._M_str,x,(Type)*(uintptr_t *)(lVar8 + 0x48)
              );
    Flow::Flow((Flow *)local_198,(Literal *)&ret.breakTo.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)&ret.breakTo.super_IString.str._M_str);
    Literal::makeFromInt64
              ((Literal *)&fail.breakTo.super_IString.str._M_str,-1,
               (Type)*(uintptr_t *)(lVar8 + 0x48));
    Flow::Flow((Flow *)local_138,(Literal *)&fail.breakTo.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)&fail.breakTo.super_IString.str._M_str);
    if (valueFlow.breakTo.super_IString.str._M_str +
        ((long)((long)deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
        3) * -0x5555555555555555 != (char *)0x1) {
LAB_001be8da:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    uVar9 = wasm::Literal::getUnsigned();
    uVar12 = x + uVar9;
    if (((CARRY8(x,uVar9)) || (10000000 < uVar12)) || (*(ulong *)(lVar8 + 0x40) < uVar12)) {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)local_138;
LAB_001be782:
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&fail);
      pFVar3 = &fail;
      pFVar4 = &fail;
      pFVar5 = &fail;
    }
    else {
      if (((long)((long)valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
          >> 3) * -0x5555555555555555 + (long)local_d8 != 1) goto LAB_001be8da;
      cVar6 = (**(code **)(**(long **)(deltaFlow.breakTo.super_IString.str._M_str + 0x200) + 0x38))
                        (*(long **)(deltaFlow.breakTo.super_IString.str._M_str + 0x200),
                         info.instance,info.name.super_IString.str._M_len,&valueFlow,uVar7,
                         uVar12 & 0xffffffff);
      if (cVar6 == '\0') {
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)local_138;
        goto LAB_001be782;
      }
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)local_198;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&ret);
      pFVar3 = &ret;
      pFVar4 = &ret;
      pFVar5 = &ret;
    }
    ppLVar11 = (pointer *)
               ((long)&(pFVar5->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl +
               0x10);
    pTVar10 = &(pFVar3->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
    pLVar1 = *(pointer *)(pTVar10 + 1);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pTVar10->id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          ((long)&(pFVar4->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl + 8);
    pTVar10->id = 0;
    pTVar10[1] = 0;
    pTVar10[2] = 0;
    pcVar2 = (char *)ppLVar11[1];
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = (size_t)*ppLVar11;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &fail.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&fail);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&ret);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)valueFlow.breakTo.super_IString.str._M_str;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&deltaFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)deltaFlow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &deltaFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&deltaFlow);
LAB_001be808:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &valueFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&valueFlow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGrow(TableGrow* curr) {
    NOTE_ENTER("TableGrow");
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow deltaFlow = self()->visit(curr->delta);
    if (deltaFlow.breaking()) {
      return deltaFlow;
    }
    auto info = getTableInstanceInfo(curr->table);

    uint64_t tableSize = info.interface()->tableSize(info.name);
    auto* table = info.instance->wasm.getTable(info.name);
    Flow ret = Literal::makeFromInt64(tableSize, table->addressType);
    Flow fail = Literal::makeFromInt64(-1, table->addressType);
    uint64_t delta = deltaFlow.getSingleValue().getUnsigned();

    uint64_t newSize;
    if (std::ckd_add(&newSize, tableSize, delta)) {
      return fail;
    }
    if (newSize > table->max || newSize > WebLimitations::MaxTableSize) {
      return fail;
    }
    if (!info.interface()->growTable(
          info.name, valueFlow.getSingleValue(), tableSize, newSize)) {
      // We failed to grow the table in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    return ret;
  }